

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int slang::ast::Statement::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  Compilation *compilation;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  bool bVar2;
  int iVar3;
  Statement *pSVar4;
  char in_CL;
  undefined4 in_register_00000014;
  StatementContext *stmtCtx;
  undefined4 in_register_0000003c;
  ForLoopStatementSyntax *syntax_00;
  ForLoopStatementSyntax *pFVar5;
  int in_R8D;
  SourceRange sourceRange;
  SourceRange local_40;
  
  syntax_00 = (ForLoopStatementSyntax *)CONCAT44(in_register_0000003c,__fd);
  stmtCtx = (StatementContext *)CONCAT44(in_register_00000014,__len);
  compilation = (Compilation *)**(undefined8 **)__addr;
  pFVar5 = syntax_00;
  if ((in_R8D == 0) && (bVar2 = hasSimpleLabel((StatementSyntax *)syntax_00), bVar2)) {
    pSVar4 = StatementContext::tryGetBlock(stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax_00);
    return (int)pSVar4;
  }
  SVar1 = (syntax_00->super_StatementSyntax).super_SyntaxNode.kind;
  switch(SVar1) {
  case ProceduralAssignStatement:
  case ProceduralForceStatement:
    pSVar4 = ProceduralAssignStatement::fromSyntax
                       (compilation,(ProceduralAssignStatementSyntax *)syntax_00,
                        (ASTContext *)__addr);
    break;
  case ProceduralDeassignStatement:
  case ProceduralReleaseStatement:
    pSVar4 = ProceduralDeassignStatement::fromSyntax
                       (compilation,(ProceduralDeassignStatementSyntax *)syntax_00,
                        (ASTContext *)__addr);
    break;
  default:
    switch(SVar1) {
    case VoidCastedCallStatement:
      pSVar4 = ExpressionStatement::fromSyntax
                         (compilation,(VoidCastedCallStatementSyntax *)syntax_00,
                          (ASTContext *)__addr);
      break;
    case VoidType:
      if ((pFVar5->super_StatementSyntax).label == (NamedLabelSyntax *)0x0) {
        return 0;
      }
      SVar1 = (pFVar5->super_StatementSyntax).super_SyntaxNode.kind;
      iVar3 = 0;
      if ((((SVar1 != ForLoopStatement) && (SVar1 != ForeachLoopStatement)) &&
          (SVar1 != ParallelBlockStatement)) &&
         ((SVar1 != RandSequenceStatement && (SVar1 != SequentialBlockStatement)))) {
        iVar3 = 1;
      }
      return iVar3;
    case WaitForkStatement:
      pSVar4 = WaitForkStatement::fromSyntax
                         (compilation,(WaitForkStatementSyntax *)syntax_00,(ASTContext *)__addr);
      break;
    case WaitOrderStatement:
      pSVar4 = WaitOrderStatement::fromSyntax
                         (compilation,(WaitOrderStatementSyntax *)syntax_00,(ASTContext *)__addr,
                          stmtCtx);
      break;
    case WaitStatement:
      pSVar4 = WaitStatement::fromSyntax
                         (compilation,(WaitStatementSyntax *)syntax_00,(ASTContext *)__addr,stmtCtx)
      ;
      break;
    default:
      if (SVar1 - CoverPropertyStatement < 2) {
LAB_002c4e75:
        pSVar4 = ConcurrentAssertionStatement::fromSyntax
                           (compilation,(ConcurrentAssertionStatementSyntax *)syntax_00,
                            (ASTContext *)__addr,stmtCtx);
      }
      else if (SVar1 - ImmediateAssumeStatement < 2) {
LAB_002c4ed1:
        pSVar4 = ImmediateAssertionStatement::fromSyntax
                           (compilation,(ImmediateAssertionStatementSyntax *)syntax_00,
                            (ASTContext *)__addr,stmtCtx);
      }
      else {
        if ((SVar1 == AssertPropertyStatement) || (SVar1 == AssumePropertyStatement))
        goto LAB_002c4e75;
        if (SVar1 == BlockingEventTriggerStatement) {
LAB_002c4efa:
          pSVar4 = EventTriggerStatement::fromSyntax
                             (compilation,(EventTriggerStatementSyntax *)syntax_00,
                              (ASTContext *)__addr,stmtCtx);
        }
        else if (SVar1 == CaseStatement) {
          pSVar4 = CaseStatement::fromSyntax
                             (compilation,(CaseStatementSyntax *)syntax_00,(ASTContext *)__addr,
                              stmtCtx);
        }
        else if (SVar1 == CheckerInstanceStatement) {
          pSVar4 = ProceduralCheckerStatement::fromSyntax
                             (compilation,(CheckerInstanceStatementSyntax *)syntax_00,
                              (ASTContext *)__addr,stmtCtx);
        }
        else if (SVar1 == ConditionalStatement) {
          pSVar4 = ConditionalStatement::fromSyntax
                             (compilation,(ConditionalStatementSyntax *)syntax_00,
                              (ASTContext *)__addr,stmtCtx);
        }
        else if (SVar1 == DisableForkStatement) {
          pSVar4 = DisableForkStatement::fromSyntax
                             (compilation,(DisableForkStatementSyntax *)syntax_00);
        }
        else if (SVar1 == DisableStatement) {
          pSVar4 = DisableStatement::fromSyntax
                             (compilation,(DisableStatementSyntax *)syntax_00,(ASTContext *)__addr);
        }
        else if (SVar1 == DoWhileStatement) {
          pSVar4 = DoWhileLoopStatement::fromSyntax
                             (compilation,(DoWhileStatementSyntax *)syntax_00,(ASTContext *)__addr,
                              stmtCtx);
        }
        else if (SVar1 == TimingControlStatement) {
          pSVar4 = TimedStatement::fromSyntax
                             (compilation,(TimingControlStatementSyntax *)syntax_00,
                              (ASTContext *)__addr,stmtCtx);
        }
        else {
          if (SVar1 == ExpectPropertyStatement) goto LAB_002c4e75;
          if (SVar1 == ExpressionStatement) {
            pSVar4 = ExpressionStatement::fromSyntax
                               (compilation,(ExpressionStatementSyntax *)syntax_00,
                                (ASTContext *)__addr,stmtCtx);
          }
          else if (SVar1 == ForLoopStatement) {
            pSVar4 = StatementContext::tryGetBlock
                               (stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax_00);
            if (pSVar4 != (Statement *)0x0) goto LAB_002c5185;
            pSVar4 = ForLoopStatement::fromSyntax
                               (compilation,syntax_00,(ASTContext *)__addr,stmtCtx);
          }
          else if (SVar1 == ForeachLoopStatement) {
            pSVar4 = StatementContext::tryGetBlock
                               (stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax_00);
            if (pSVar4 != (Statement *)0x0) goto LAB_002c5185;
            pSVar4 = ForeachLoopStatement::fromSyntax
                               (compilation,(ForeachLoopStatementSyntax *)syntax_00,
                                (ASTContext *)__addr,stmtCtx);
          }
          else if (SVar1 == ForeverStatement) {
            pSVar4 = ForeverLoopStatement::fromSyntax
                               (compilation,(ForeverStatementSyntax *)syntax_00,(ASTContext *)__addr
                                ,stmtCtx);
          }
          else {
            if (SVar1 == ImmediateAssertStatement) goto LAB_002c4ed1;
            if (SVar1 == JumpStatement) {
              if ((syntax_00->forKeyword).kind == BreakKeyword) {
                pSVar4 = BreakStatement::fromSyntax
                                   (compilation,(JumpStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr,stmtCtx);
              }
              else {
                pSVar4 = ContinueStatement::fromSyntax
                                   (compilation,(JumpStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr,stmtCtx);
              }
            }
            else if (SVar1 == LoopStatement) {
              if ((syntax_00->forKeyword).kind == RepeatKeyword) {
                pSVar4 = RepeatLoopStatement::fromSyntax
                                   (compilation,(LoopStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr,stmtCtx);
              }
              else {
                pSVar4 = WhileLoopStatement::fromSyntax
                                   (compilation,(LoopStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr,stmtCtx);
              }
            }
            else {
              if (SVar1 == NonblockingEventTriggerStatement) goto LAB_002c4efa;
              if (SVar1 == ParallelBlockStatement) {
LAB_002c4e45:
                pSVar4 = StatementContext::tryGetBlock
                                   (stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax_00);
                if (pSVar4 != (Statement *)0x0) goto LAB_002c5185;
                pSVar4 = BlockStatement::fromSyntax
                                   (compilation,(BlockStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr,stmtCtx,false);
              }
              else if (SVar1 == RandCaseStatement) {
                pSVar4 = RandCaseStatement::fromSyntax
                                   (compilation,(RandCaseStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr,stmtCtx);
              }
              else if (SVar1 == RandSequenceStatement) {
                pSVar4 = StatementContext::tryGetBlock
                                   (stmtCtx,(ASTContext *)__addr,(SyntaxNode *)syntax_00);
                if (pSVar4 != (Statement *)0x0) goto LAB_002c5185;
                pSVar4 = RandSequenceStatement::fromSyntax
                                   (compilation,(RandSequenceStatementSyntax *)syntax_00,
                                    (ASTContext *)__addr);
              }
              else {
                if (SVar1 == RestrictPropertyStatement) goto LAB_002c4e75;
                if (SVar1 == ReturnStatement) {
                  pSVar4 = ReturnStatement::fromSyntax
                                     (compilation,(ReturnStatementSyntax *)syntax_00,
                                      (ASTContext *)__addr,stmtCtx);
                }
                else {
                  if (SVar1 == SequentialBlockStatement) goto LAB_002c4e45;
                  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
                  pSVar4 = &BumpAllocator::emplace<slang::ast::EmptyStatement,slang::SourceRange>
                                      ((BumpAllocator *)compilation,&local_40)->super_Statement;
                  if ((in_CL != '\0') &&
                     ((syntax_00->super_StatementSyntax).attributes.
                      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                      _M_extent._M_extent_value == 0)) {
                    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
                    ASTContext::addDiag((ASTContext *)__addr,(DiagCode)0x590008,sourceRange);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pSVar4->syntax = (StatementSyntax *)syntax_00;
  syntax._M_ptr =
       (syntax_00->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax._M_extent._M_extent_value =
       (syntax_00->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  ASTContext::setAttributes((ASTContext *)__addr,pSVar4,syntax);
LAB_002c5185:
  return (int)pSVar4;
}

Assistant:

const Statement& Statement::bind(const StatementSyntax& syntax, const ASTContext& context,
                                 StatementContext& stmtCtx, bool inList, bool labelHandled) {
    auto& comp = context.getCompilation();

    if (!labelHandled && hasSimpleLabel(syntax)) {
        auto block = stmtCtx.tryGetBlock(context, syntax);
        SLANG_ASSERT(block);
        return *block;
    }

    Statement* result;
    switch (syntax.kind) {
        case SyntaxKind::EmptyStatement:
            result = comp.emplace<EmptyStatement>(syntax.sourceRange());
            if (inList && syntax.attributes.empty())
                context.addDiag(diag::EmptyStatement, syntax.sourceRange());
            break;
        case SyntaxKind::ReturnStatement:
            result = &ReturnStatement::fromSyntax(comp, syntax.as<ReturnStatementSyntax>(), context,
                                                  stmtCtx);
            break;
        case SyntaxKind::JumpStatement: {
            auto& jump = syntax.as<JumpStatementSyntax>();
            if (jump.breakOrContinue.kind == TokenKind::BreakKeyword)
                result = &BreakStatement::fromSyntax(comp, jump, context, stmtCtx);
            else
                result = &ContinueStatement::fromSyntax(comp, jump, context, stmtCtx);
            break;
        }
        case SyntaxKind::DisableStatement:
            result = &DisableStatement::fromSyntax(comp, syntax.as<DisableStatementSyntax>(),
                                                   context);
            break;
        case SyntaxKind::ConditionalStatement:
            result = &ConditionalStatement::fromSyntax(comp,
                                                       syntax.as<ConditionalStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::CaseStatement:
            result = &CaseStatement::fromSyntax(comp, syntax.as<CaseStatementSyntax>(), context,
                                                stmtCtx);
            break;
        case SyntaxKind::ForLoopStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &ForLoopStatement::fromSyntax(comp, syntax.as<ForLoopStatementSyntax>(),
                                                   context, stmtCtx);
            break;
        case SyntaxKind::LoopStatement: {
            auto& loop = syntax.as<LoopStatementSyntax>();
            if (loop.repeatOrWhile.kind == TokenKind::RepeatKeyword)
                result = &RepeatLoopStatement::fromSyntax(comp, loop, context, stmtCtx);
            else
                result = &WhileLoopStatement::fromSyntax(comp, loop, context, stmtCtx);
            break;
        }
        case SyntaxKind::ForeachLoopStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &ForeachLoopStatement::fromSyntax(comp,
                                                       syntax.as<ForeachLoopStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::DoWhileStatement:
            result = &DoWhileLoopStatement::fromSyntax(comp, syntax.as<DoWhileStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::ForeverStatement:
            result = &ForeverLoopStatement::fromSyntax(comp, syntax.as<ForeverStatementSyntax>(),
                                                       context, stmtCtx);
            break;
        case SyntaxKind::ExpressionStatement:
            result = &ExpressionStatement::fromSyntax(comp, syntax.as<ExpressionStatementSyntax>(),
                                                      context, stmtCtx);
            break;
        case SyntaxKind::VoidCastedCallStatement:
            result = &ExpressionStatement::fromSyntax(comp,
                                                      syntax.as<VoidCastedCallStatementSyntax>(),
                                                      context);
            break;
        case SyntaxKind::SequentialBlockStatement:
        case SyntaxKind::ParallelBlockStatement:
            // A block statement may or may not match up with a hierarchy node. Handle both cases
            // here. We traverse statements in the same order as the findBlocks call below, so this
            // should always sync up exactly.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &BlockStatement::fromSyntax(comp, syntax.as<BlockStatementSyntax>(), context,
                                                 stmtCtx);
            break;
        case SyntaxKind::TimingControlStatement:
            result = &TimedStatement::fromSyntax(comp, syntax.as<TimingControlStatementSyntax>(),
                                                 context, stmtCtx);
            break;
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
            result = &ImmediateAssertionStatement::fromSyntax(
                comp, syntax.as<ImmediateAssertionStatementSyntax>(), context, stmtCtx);
            break;
        case SyntaxKind::DisableForkStatement:
            result = &DisableForkStatement::fromSyntax(comp,
                                                       syntax.as<DisableForkStatementSyntax>());
            break;
        case SyntaxKind::WaitStatement:
            result = &WaitStatement::fromSyntax(comp, syntax.as<WaitStatementSyntax>(), context,
                                                stmtCtx);
            break;
        case SyntaxKind::WaitForkStatement:
            result = &WaitForkStatement::fromSyntax(comp, syntax.as<WaitForkStatementSyntax>(),
                                                    context);
            break;
        case SyntaxKind::WaitOrderStatement:
            result = &WaitOrderStatement::fromSyntax(comp, syntax.as<WaitOrderStatementSyntax>(),
                                                     context, stmtCtx);
            break;
        case SyntaxKind::BlockingEventTriggerStatement:
        case SyntaxKind::NonblockingEventTriggerStatement:
            result = &EventTriggerStatement::fromSyntax(comp,
                                                        syntax.as<EventTriggerStatementSyntax>(),
                                                        context, stmtCtx);
            break;
        case SyntaxKind::ProceduralAssignStatement:
        case SyntaxKind::ProceduralForceStatement:
            result = &ProceduralAssignStatement::fromSyntax(
                comp, syntax.as<ProceduralAssignStatementSyntax>(), context);
            break;
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralReleaseStatement:
            result = &ProceduralDeassignStatement::fromSyntax(
                comp, syntax.as<ProceduralDeassignStatementSyntax>(), context);
            break;
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::RestrictPropertyStatement:
            result = &ConcurrentAssertionStatement::fromSyntax(
                comp, syntax.as<ConcurrentAssertionStatementSyntax>(), context, stmtCtx);
            break;
        case SyntaxKind::RandCaseStatement:
            result = &RandCaseStatement::fromSyntax(comp, syntax.as<RandCaseStatementSyntax>(),
                                                    context, stmtCtx);
            break;
        case SyntaxKind::RandSequenceStatement:
            // We might have an implicit block here; check for that first.
            if (auto block = stmtCtx.tryGetBlock(context, syntax))
                return *block;

            result = &RandSequenceStatement::fromSyntax(comp,
                                                        syntax.as<RandSequenceStatementSyntax>(),
                                                        context);
            break;
        case SyntaxKind::CheckerInstanceStatement:
            result = &ProceduralCheckerStatement::fromSyntax(
                comp, syntax.as<CheckerInstanceStatementSyntax>(), context, stmtCtx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    context.setAttributes(*result, syntax.attributes);
    return *result;
}